

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void plot_float(t_plot *x,t_floatarg f)

{
  if (((x->x_vis).fd_type == '\x01') && ((x->x_vis).fd_var == '\0')) {
    if ((f != 0.0) != ((x->x_vis).fd_un.fd_float != 0.0)) {
      canvas_redrawallfortemplatecanvas(x->x_canvas,2);
      (x->x_vis).fd_type = '\x01';
      (x->x_vis).fd_var = '\0';
      (x->x_vis).fd_un.fd_float = (t_float)(-(uint)(f != 0.0) & 0x3f800000);
      (x->x_vis).fd_v1 = 0.0;
      (x->x_vis).fd_v2 = 0.0;
      (x->x_vis).fd_screen1 = 0.0;
      (x->x_vis).fd_screen2 = 0.0;
      (x->x_vis).fd_quantum = 0.0;
      canvas_redrawallfortemplatecanvas(x->x_canvas,1);
      return;
    }
    return;
  }
  pd_error(x,"global vis/invis for a template with variable visibility");
  return;
}

Assistant:

void plot_float(t_plot *x, t_floatarg f)
{
    int viswas;
    if (x->x_vis.fd_type != A_FLOAT || x->x_vis.fd_var)
    {
        pd_error(x, "global vis/invis for a template with variable visibility");
        return;
    }
    viswas = (x->x_vis.fd_un.fd_float != 0);

    if ((f != 0 && viswas) || (f == 0 && !viswas))
        return;
    canvas_redrawallfortemplatecanvas(x->x_canvas, 2);
    fielddesc_setfloat_const(&x->x_vis, (f != 0));
    canvas_redrawallfortemplatecanvas(x->x_canvas, 1);
}